

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<unsigned_int> **objToLoad,int initSize,bool toCallDestructor,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  ValueVectorOf<unsigned_int> *this;
  XMLSize_t maxElems;
  XMLSize_t i;
  ulong uVar3;
  XMLSize_t vectorSize;
  uint data;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (ValueVectorOf<unsigned_int> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      maxElems = 0x10;
      if (-1 < initSize) {
        maxElems = (XMLSize_t)(uint)initSize;
      }
      ValueVectorOf<unsigned_int>::ValueVectorOf(this,maxElems,pMVar2,toCallDestructor);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    vectorSize = 0;
    XSerializeEngine::readSize(serEng,&vectorSize);
    for (uVar3 = 0; uVar3 < vectorSize; uVar3 = uVar3 + 1) {
      XSerializeEngine::operator>>(serEng,&data);
      ValueVectorOf<unsigned_int>::addElement(*objToLoad,&data);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<unsigned int>**       objToLoad
                                   , int                                 initSize
                                   , bool                                toCallDestructor
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<unsigned int>(
                                                         initSize
                                                       , serEng.getMemoryManager()
                                                       , toCallDestructor
                                                       );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            unsigned int data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}